

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall LowDiscrepancy_Sobol_Test::TestBody(LowDiscrepancy_Sobol_Test *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  ulong *puVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  char *pcVar8;
  int dim;
  long lVar9;
  undefined1 *puVar10;
  uint *puVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM3 [16];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  float local_48 [2];
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  uVar7 = 0;
  do {
    puVar10 = pbrt::SobolMatrices64;
    puVar11 = &pbrt::SobolMatrices32;
    lVar9 = 0;
    do {
      if (uVar7 == 0) {
        local_50.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_50.ptr_._4_4_ << 0x20);
LAB_002e1a28:
        auVar13 = ZEXT816(0) << 0x40;
      }
      else {
        uVar2 = 0;
        puVar4 = puVar11;
        uVar6 = uVar7;
        do {
          if ((uVar6 & 1) != 0) {
            uVar2 = uVar2 ^ *puVar4;
          }
          puVar4 = puVar4 + 1;
          bVar12 = 1 < uVar6;
          uVar6 = uVar6 >> 1;
        } while (bVar12);
        auVar13 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,uVar2);
        auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                             ZEXT416((uint)(auVar13._0_4_ * 2.3283064e-10)));
        local_50.ptr_._0_4_ = auVar13._0_4_;
        if (uVar7 == 0) goto LAB_002e1a28;
        uVar3 = 0;
        puVar5 = (ulong *)puVar10;
        uVar6 = uVar7;
        do {
          if ((uVar6 & 1) != 0) {
            uVar3 = uVar3 ^ *puVar5;
          }
          puVar5 = puVar5 + 1;
          bVar12 = 1 < uVar6;
          uVar6 = uVar6 >> 1;
        } while (bVar12);
        auVar1 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,uVar3);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = auVar1._0_8_ * 2.220446049250313e-16;
      }
      auVar13 = vminsd_avx(ZEXT816(0x3fefffffffffffff),auVar13);
      local_48[0] = (float)auVar13._0_8_;
      testing::internal::CmpHelperEQ<float,float>
                (local_40,"SobolSampleFloat(i, dim, NoRandomizer())",
                 "(float)SobolSampleDouble(i, dim, NoRandomizer())",(float *)&local_50,local_48);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        pcVar8 = "";
        if (local_38.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = ((local_38.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x98,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
        if (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar12 = testing::internal::IsTrue(true);
          if ((bVar12) &&
             (local_50.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_50.ptr_ + 8))();
          }
          local_50.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar9 = lVar9 + 1;
      puVar11 = puVar11 + 0x34;
      puVar10 = (undefined1 *)((long)puVar10 + 0x1a0);
    } while (lVar9 != 100);
    uVar7 = uVar7 + 1;
    if (uVar7 == 0x100) {
      uVar7 = 0;
      do {
        if (uVar7 == 0) {
          auVar13 = ZEXT816(0) << 0x40;
        }
        else {
          uVar2 = 0;
          puVar11 = &pbrt::SobolMatrices32;
          uVar6 = uVar7;
          do {
            if ((uVar6 & 1) != 0) {
              uVar2 = uVar2 ^ *puVar11;
            }
            puVar11 = puVar11 + 1;
            bVar12 = 1 < uVar6;
            uVar6 = uVar6 >> 1;
          } while (bVar12);
          auVar13 = vcvtusi2ss_avx512f(in_XMM3,uVar2);
          auVar13 = ZEXT416((uint)(auVar13._0_4_ * 2.3283064e-10));
        }
        auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar13);
        local_50.ptr_._0_4_ = auVar13._0_4_;
        auVar1._8_8_ = 0x8040201008040201;
        auVar1._0_8_ = 0x8040201008040201;
        auVar13 = vgf2p8affineqb_avx512vl(ZEXT416((uint)uVar7),auVar1,0);
        uVar2 = auVar13._0_4_;
        auVar13 = vcvtusi2ss_avx512f(in_XMM3,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 |
                                             (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
        local_48[0] = auVar13._0_4_ * 2.3283064e-10;
        testing::internal::CmpHelperEQ<float,float>
                  (local_40,"SobolSampleFloat(i, 0, NoRandomizer())",
                   "ReverseBits32(i) * 2.3283064365386963e-10f",(float *)&local_50,local_48);
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_50);
          pcVar8 = "";
          if (local_38.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                     ,0x9f,pcVar8);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
          if (local_50.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar12 = testing::internal::IsTrue(true);
            if ((bVar12) &&
               (local_50.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_50.ptr_ + 8))();
            }
            local_50.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uVar7 = uVar7 + 1;
      } while (uVar7 != 0x2000);
      return;
    }
  } while( true );
}

Assistant:

TEST(LowDiscrepancy, Sobol) {
    // Check that float and double variants match (as float values).
    for (int i = 0; i < 256; ++i) {
        for (int dim = 0; dim < 100; ++dim) {
            EXPECT_EQ(SobolSampleFloat(i, dim, NoRandomizer()),
                      (float)SobolSampleDouble(i, dim, NoRandomizer()));
        }
    }

    // Make sure first dimension is the regular base 2 radical inverse
    for (int i = 0; i < 8192; ++i) {
        EXPECT_EQ(SobolSampleFloat(i, 0, NoRandomizer()),
                  ReverseBits32(i) * 2.3283064365386963e-10f);
    }
}